

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

double __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
compute_expected_cost
          (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
           *this,double frac_inserts)

{
  bool bVar1;
  ExpectedSearchIterationsAccumulator *this_00;
  int *piVar2;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double cost;
  int predicted_position;
  const_iterator_type it;
  ExpectedShiftsAccumulator shifts_accumulator;
  ExpectedSearchIterationsAccumulator search_iters_accumulator;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  ExpectedShiftsAccumulator *in_stack_ffffffffffffff60;
  Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>,_const_int,_const_std::pair<int,_int>_>
  *in_stack_ffffffffffffff70;
  int local_88;
  int local_84 [3];
  Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>,_const_int,_const_std::pair<int,_int>_>
  local_78;
  ExpectedShiftsAccumulator local_50;
  ExpectedSearchIterationsAccumulator local_30;
  double local_18;
  double local_8;
  
  if (*(int *)(in_RDI + 0x5c) == 0) {
    local_8 = 0.0;
  }
  else {
    local_18 = in_XMM0_Qa;
    ExpectedSearchIterationsAccumulator::ExpectedSearchIterationsAccumulator
              ((ExpectedSearchIterationsAccumulator *)in_stack_ffffffffffffff60);
    ExpectedShiftsAccumulator::ExpectedShiftsAccumulator
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>,_const_int,_const_std::pair<int,_int>_>
    ::Iterator((Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>,_const_int,_const_std::pair<int,_int>_>
                *)in_stack_ffffffffffffff60,
               (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
    while( true ) {
      bVar1 = Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>,_const_int,_const_std::pair<int,_int>_>
              ::is_end(&local_78);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_84[1] = 0;
      local_84[0] = *(int *)(in_RDI + 0x58) + -1;
      this_00 = (ExpectedSearchIterationsAccumulator *)(in_RDI + 0x10);
      piVar2 = Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>,_const_int,_const_std::pair<int,_int>_>
               ::key(&local_78);
      local_88 = LinearModel<int>::predict((LinearModel<int> *)this_00,*piVar2);
      piVar2 = std::min<int>(local_84,&local_88);
      piVar2 = std::max<int>(local_84 + 1,piVar2);
      local_84[2] = *piVar2;
      ExpectedSearchIterationsAccumulator::accumulate
                (this_00,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
      ExpectedShiftsAccumulator::accumulate(&local_50,local_78.cur_idx_,local_84[2]);
      Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>,_const_int,_const_std::pair<int,_int>_>
      ::operator++(in_stack_ffffffffffffff70,(int)((ulong)in_RDI >> 0x20));
    }
    dVar3 = ExpectedSearchIterationsAccumulator::get_stat(&local_30);
    *(double *)(in_RDI + 0xb8) = dVar3;
    dVar3 = ExpectedShiftsAccumulator::get_stat(&local_50);
    *(double *)(in_RDI + 0xc0) = dVar3;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(ulong *)(in_RDI + 0xb8);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(double *)(in_RDI + 0xc0) * 0.5 * local_18;
    auVar4 = vfmadd213sd_fma(ZEXT816(0x4034000000000000),auVar4,auVar5);
    local_8 = auVar4._0_8_;
    ExpectedShiftsAccumulator::~ExpectedShiftsAccumulator((ExpectedShiftsAccumulator *)0x16a003);
    ExpectedSearchIterationsAccumulator::~ExpectedSearchIterationsAccumulator
              ((ExpectedSearchIterationsAccumulator *)0x16a00d);
  }
  return local_8;
}

Assistant:

double compute_expected_cost(double frac_inserts = 0) {
    if (num_keys_ == 0) {
      return 0;
    }

    ExpectedSearchIterationsAccumulator search_iters_accumulator;
    ExpectedShiftsAccumulator shifts_accumulator(data_capacity_);
    const_iterator_type it(this, 0);
    for (; !it.is_end(); it++) {
      int predicted_position = std::max(
          0, std::min(data_capacity_ - 1, this->model_.predict(it.key())));
      search_iters_accumulator.accumulate(it.cur_idx_, predicted_position);
      shifts_accumulator.accumulate(it.cur_idx_, predicted_position);
    }
    expected_avg_exp_search_iterations_ = search_iters_accumulator.get_stat();
    expected_avg_shifts_ = shifts_accumulator.get_stat();
    double cost =
        kExpSearchIterationsWeight * expected_avg_exp_search_iterations_ +
        kShiftsWeight * expected_avg_shifts_ * frac_inserts;
    return cost;
  }